

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tiny_gltf.h
# Opt level: O1

bool tinygltf::detail::
     ForEachInArray<tinygltf::TinyGLTF::LoadFromString(tinygltf::Model*,std::__cxx11::string*,std::__cxx11::string*,char_const*,unsigned_int,std::__cxx11::string_const&,unsigned_int)::__12>
               (json *_v,char *member,anon_class_24_3_07ed8cb9 *cb)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  char cVar2;
  string *err;
  bool bVar3;
  bool bVar4;
  reference pbVar5;
  string *psVar6;
  string *err_00;
  string *property;
  json *extraout_RDX;
  json *extraout_RDX_00;
  json *extraout_RDX_01;
  json *extraout_RDX_02;
  json *extraout_RDX_03;
  json *extraout_RDX_04;
  json *extraout_RDX_05;
  json *extraout_RDX_06;
  json *extraout_RDX_07;
  json *extraout_RDX_08;
  json *pjVar7;
  json *extraout_RDX_09;
  json *extraout_RDX_10;
  json *extraout_RDX_11;
  json *extraout_RDX_12;
  json *extraout_RDX_13;
  json *extraout_RDX_14;
  json_const_iterator it_1;
  int samplerIndex;
  int targetIndex;
  json_const_iterator targetIt;
  json_const_iterator channelsIt;
  json_const_array_iterator i;
  AnimationChannel channel;
  json_const_array_iterator channelEnd;
  json_const_iterator itm;
  json_const_array_iterator it;
  json_const_array_iterator end;
  string local_548;
  string local_528;
  int local_508;
  undefined4 local_504;
  string *local_500;
  int local_4f4;
  char *local_4f0;
  json_const_iterator local_4e8;
  Value *local_4c0;
  ExtensionMap *local_4b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_4b0;
  json_const_iterator local_4a8;
  ExtensionMap *local_480;
  _Base_ptr local_478;
  size_t *local_470;
  const_iterator local_468;
  undefined1 local_448 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_430;
  Value local_420;
  ExtensionMap local_388;
  undefined1 auStack_358 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_338;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_328;
  pointer local_318;
  pointer pVStack_310;
  pointer local_308;
  pointer pVStack_300;
  _Rb_tree_node_base local_2f0;
  size_t local_2d0;
  bool local_2c8;
  ExtensionMap local_2c0;
  _Alloc_hider local_290;
  size_type local_288;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_280;
  _Alloc_hider local_270;
  size_type local_268;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_260;
  _Alloc_hider local_250;
  size_type local_248;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_240;
  _Alloc_hider local_230;
  size_type local_228;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_220;
  const_iterator local_210;
  undefined1 local_1f0 [280];
  _Alloc_hider local_d8;
  size_type local_d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c8;
  _Alloc_hider local_b8;
  size_type local_b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a8;
  json_const_iterator local_98;
  const_iterator local_70;
  const_iterator local_50;
  
  local_98.m_it.array_iterator._M_current =
       (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
        *)0x0;
  local_98.m_object = (pointer)0x0;
  local_98.m_it.object_iterator._M_node = (_Base_ptr)0x0;
  local_98.m_it.primitive_iterator.m_it = -0x8000000000000000;
  local_4f0 = member;
  bVar3 = FindMember(_v,"animations",&local_98);
  if ((bVar3) &&
     (pbVar5 = nlohmann::detail::
               iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
               ::operator*(&local_98), pbVar5->m_type == array)) {
    pbVar5 = nlohmann::detail::
             iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
             ::operator*(&local_98);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::cbegin(&local_70,pbVar5);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::cend(&local_50,pbVar5);
    bVar3 = nlohmann::detail::
            iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
            ::
            operator==<nlohmann::detail::iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_nullptr>
                      (&local_70,&local_50);
    if (!bVar3) {
      local_478 = (_Base_ptr)(local_1f0 + 0xf0);
      local_470 = &local_388._M_t._M_impl.super__Rb_tree_header._M_node_count;
      local_4c0 = (Value *)auStack_358;
      local_480 = (ExtensionMap *)(local_1f0 + 0xe8);
      local_4b0 = &local_338;
      local_4b8 = &local_388;
      do {
        psVar6 = (string *)
                 nlohmann::detail::
                 iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                 ::operator*(&local_70);
        if (*(value_t *)&(psVar6->_M_dataplus)._M_p != object) {
          if ((char *)**(undefined8 **)local_4f0 == (char *)0x0) {
            return false;
          }
          std::__cxx11::string::append((char *)**(undefined8 **)local_4f0);
          return false;
        }
        local_1f0._0_8_ = local_1f0 + 0x10;
        local_1f0._8_8_ = 0;
        local_1f0[0x10] = '\0';
        local_1f0._80_4_ = 0;
        local_1f0._84_4_ = 0;
        local_1f0._88_8_ = 0.0;
        local_1f0._64_8_ = (pointer)0x0;
        local_1f0._72_8_ = (pointer)0x0;
        local_1f0._48_8_ = (pointer)0x0;
        local_1f0._56_8_ = (pointer)0x0;
        local_1f0._32_8_ = (pointer)0x0;
        local_1f0._40_8_ = (pointer)0x0;
        local_1f0._96_8_ = local_1f0 + 0x70;
        local_1f0._104_8_ = 0;
        local_1f0[0x70] = '\0';
        local_1f0._184_4_ = _S_red;
        local_1f0._192_8_ = (_Base_ptr)0x0;
        local_1f0._160_8_ = (pointer)0x0;
        local_1f0._168_8_ = (pointer)0x0;
        local_1f0._144_8_ = (pointer)0x0;
        local_1f0._152_8_ = (pointer)0x0;
        local_1f0._128_8_ = (pointer)0x0;
        local_1f0._136_8_ = (pointer)0x0;
        local_1f0._200_8_ = local_1f0 + 0xb8;
        local_1f0._216_8_ = 0;
        local_1f0[0xe0] = false;
        local_1f0._240_4_ = _S_red;
        local_1f0._248_8_ = (_Base_ptr)0x0;
        local_1f0._256_8_ = local_478;
        local_1f0._264_8_ = local_478;
        local_1f0._272_8_ = 0;
        local_d8._M_p = (pointer)&local_c8;
        local_d0 = 0;
        local_c8._M_local_buf[0] = '\0';
        local_b8._M_p = (pointer)&local_a8;
        local_b0 = 0;
        local_a8._M_local_buf[0] = '\0';
        property = *(string **)local_4f0;
        err = (string *)(property->_M_dataplus)._M_p;
        cVar2 = *(char *)(*(long *)(local_4f0 + 8) + 0x19);
        local_4a8.m_it.array_iterator._M_current =
             (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              *)0x0;
        local_4a8.m_object = (pointer)0x0;
        local_4a8.m_it.object_iterator._M_node = (_Base_ptr)0x0;
        local_4a8.m_it.primitive_iterator.m_it = -0x8000000000000000;
        local_500 = psVar6;
        local_1f0._208_8_ = local_1f0._200_8_;
        bVar3 = FindMember((json *)psVar6,"channels",&local_4a8);
        if ((bVar3) &&
           (pbVar5 = nlohmann::detail::
                     iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                     ::operator*(&local_4a8), pbVar5->m_type == array)) {
          pbVar5 = nlohmann::detail::
                   iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                   ::operator*(&local_4a8);
          nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          ::cend(&local_210,pbVar5);
          pbVar5 = nlohmann::detail::
                   iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                   ::operator*(&local_4a8);
          nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          ::cbegin(&local_468,pbVar5);
          bVar3 = nlohmann::detail::
                  iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                  ::
                  operator==<nlohmann::detail::iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_nullptr>
                            (&local_468,&local_210);
          while (bVar3 == false) {
            local_448._0_8_ = (pointer)0xffffffffffffffff;
            local_448._8_8_ = &aStack_430;
            local_448._16_8_ = 0;
            aStack_430._M_allocated_capacity = aStack_430._M_allocated_capacity & 0xffffffffffffff00
            ;
            local_420.type_ = 0;
            local_420.int_value_ = 0;
            local_420.real_value_ = 0.0;
            local_420.string_value_._M_dataplus._M_p = (pointer)&local_420.string_value_.field_2;
            local_420.string_value_._M_string_length = 0;
            local_420.string_value_.field_2._M_local_buf[0] = '\0';
            local_420.object_value_._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
            local_420.object_value_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
                 (_Base_ptr)0x0;
            local_420.array_value_.
            super__Vector_base<tinygltf::Value,_std::allocator<tinygltf::Value>_>._M_impl.
            super__Vector_impl_data._M_finish = (pointer)0x0;
            local_420.array_value_.
            super__Vector_base<tinygltf::Value,_std::allocator<tinygltf::Value>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            local_420.binary_value_.
            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            local_420.array_value_.
            super__Vector_base<tinygltf::Value,_std::allocator<tinygltf::Value>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)0x0;
            local_420.binary_value_.
            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)0x0;
            local_420.binary_value_.
            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_finish = (pointer)0x0;
            local_420.object_value_._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
                 &local_420.object_value_._M_t._M_impl.super__Rb_tree_header._M_header;
            local_420.object_value_._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
            local_420.boolean_value_ = false;
            local_388._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
            local_388._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
            local_388._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
                 &local_388._M_t._M_impl.super__Rb_tree_header._M_header;
            local_470[2] = 0;
            *local_470 = 0;
            local_470[1] = 0;
            auStack_358._16_8_ = local_4b0;
            auStack_358._24_8_ = 0;
            local_338._M_local_buf[0] = '\0';
            local_2f0._M_color = _S_red;
            local_2f0._M_parent = (_Base_ptr)0x0;
            local_308 = (pointer)0x0;
            pVStack_300 = (pointer)0x0;
            local_318 = (pointer)0x0;
            pVStack_310 = (pointer)0x0;
            local_328._M_allocated_capacity = 0;
            local_328._8_8_ = (pointer)0x0;
            local_2f0._M_left = &local_2f0;
            local_2d0 = 0;
            local_2c8 = false;
            local_2c0._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
            local_2c0._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
            local_2c0._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
                 &local_2c0._M_t._M_impl.super__Rb_tree_header._M_header;
            local_2c0._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
            local_290._M_p = (pointer)&local_280;
            local_288 = 0;
            local_280._M_local_buf[0] = '\0';
            local_270._M_p = (pointer)&local_260;
            local_268 = 0;
            local_260._M_local_buf[0] = '\0';
            local_250._M_p = (pointer)&local_240;
            local_248 = 0;
            local_240._M_local_buf[0] = '\0';
            local_230._M_p = (pointer)&local_220;
            local_228 = 0;
            local_220._M_local_buf[0] = '\0';
            local_420.object_value_._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
                 local_420.object_value_._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
            local_388._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
                 local_388._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
            local_2f0._M_right = local_2f0._M_left;
            local_2c0._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
                 local_2c0._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
            psVar6 = (string *)
                     nlohmann::detail::
                     iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                     ::operator*(&local_468);
            local_508 = -1;
            local_4f4 = -1;
            local_548.field_2._M_local_buf[4] = 'l';
            local_548.field_2._M_local_buf[5] = 'e';
            local_548.field_2._M_local_buf[6] = 'r';
            local_548.field_2._M_local_buf[0] = 's';
            local_548.field_2._M_allocated_capacity._1_2_ = 0x6d61;
            local_548.field_2._M_local_buf[3] = 'p';
            local_548._M_string_length = 7;
            local_548.field_2._M_local_buf[7] = '\0';
            local_528._M_dataplus._M_p = (pointer)&local_528.field_2;
            local_4e8.m_object = (pointer)0x10;
            local_548._M_dataplus._M_p = (pointer)&local_548.field_2;
            local_528._M_dataplus._M_p =
                 (pointer)std::__cxx11::string::_M_create((ulong *)&local_528,(ulong)&local_4e8);
            local_528.field_2._M_allocated_capacity = (size_type)local_4e8.m_object;
            *(undefined8 *)local_528._M_dataplus._M_p = 0x6f6974616d696e41;
            *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_528._M_dataplus._M_p + 8) = 'n';
            *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_528._M_dataplus._M_p + 9) = 'C';
            *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_528._M_dataplus._M_p + 10) = 'h';
            *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_528._M_dataplus._M_p + 0xb) = 'a';
            *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_528._M_dataplus._M_p + 0xc) = 'n';
            *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_528._M_dataplus._M_p + 0xd) = 'n';
            *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_528._M_dataplus._M_p + 0xe) = 'e';
            *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_528._M_dataplus._M_p + 0xf) = 'l';
            local_528._M_string_length = (size_type)local_4e8.m_object;
            local_528._M_dataplus._M_p[(long)local_4e8.m_object] = '\0';
            property = &local_548;
            bVar3 = ParseIntegerProperty(&local_508,err,(json *)psVar6,property,true,&local_528);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_528._M_dataplus._M_p != &local_528.field_2) {
              operator_delete(local_528._M_dataplus._M_p);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_548._M_dataplus._M_p != &local_548.field_2) {
              operator_delete(local_548._M_dataplus._M_p);
            }
            if (bVar3) {
              local_4e8.m_it.array_iterator._M_current =
                   (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                    *)0x0;
              local_4e8.m_object = (pointer)0x0;
              local_4e8.m_it.object_iterator._M_node = (_Base_ptr)0x0;
              local_4e8.m_it.primitive_iterator.m_it = -0x8000000000000000;
              bVar3 = FindMember((json *)psVar6,"target",&local_4e8);
              pjVar7 = extraout_RDX;
              if ((bVar3) &&
                 (pbVar5 = nlohmann::detail::
                           iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                           ::operator*(&local_4e8), pjVar7 = extraout_RDX_00,
                 pbVar5->m_type == object)) {
                err_00 = (string *)
                         nlohmann::detail::
                         iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                         ::operator*(&local_4e8);
                local_548._M_dataplus._M_p = (pointer)&local_548.field_2;
                local_548.field_2._M_local_buf[0] = 'n';
                local_548.field_2._M_allocated_capacity._1_2_ = 0x646f;
                local_548.field_2._M_local_buf[3] = 'e';
                local_548._M_string_length = 4;
                local_548.field_2._M_local_buf[4] = '\0';
                paVar1 = &local_528.field_2;
                local_528._M_string_length = 0;
                local_528.field_2._M_allocated_capacity =
                     local_528.field_2._M_allocated_capacity & 0xffffffffffffff00;
                local_528._M_dataplus._M_p = (pointer)paVar1;
                ParseIntegerProperty(&local_4f4,err,(json *)err_00,&local_548,false,&local_528);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_528._M_dataplus._M_p != paVar1) {
                  operator_delete(local_528._M_dataplus._M_p);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_548._M_dataplus._M_p != &local_548.field_2) {
                  operator_delete(local_548._M_dataplus._M_p);
                }
                local_548._M_dataplus._M_p = (pointer)&local_548.field_2;
                local_548.field_2._M_local_buf[0] = 'p';
                local_548.field_2._M_allocated_capacity._1_2_ = 0x7461;
                local_548.field_2._M_local_buf[3] = 'h';
                local_548._M_string_length = 4;
                local_548.field_2._M_local_buf[4] = '\0';
                local_528._M_string_length = 0;
                local_528.field_2._M_allocated_capacity =
                     local_528.field_2._M_allocated_capacity & 0xffffffffffffff00;
                property = &local_548;
                local_528._M_dataplus._M_p = (pointer)paVar1;
                bVar3 = ParseStringProperty((string *)(local_448 + 8),err,(json *)err_00,property,
                                            true,&local_528);
                pjVar7 = extraout_RDX_01;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_528._M_dataplus._M_p != paVar1) {
                  operator_delete(local_528._M_dataplus._M_p);
                  pjVar7 = extraout_RDX_02;
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_548._M_dataplus._M_p != &local_548.field_2) {
                  operator_delete(local_548._M_dataplus._M_p);
                  pjVar7 = extraout_RDX_03;
                }
                if (bVar3) {
                  ParseExtensionsProperty(&local_2c0,err_00,pjVar7);
                  ParseExtrasProperty(local_4c0,(json *)err_00);
                  pjVar7 = extraout_RDX_04;
                  if (cVar2 != '\0') {
                    local_548.field_2._M_local_buf[0] = '\0';
                    local_548.field_2._M_allocated_capacity._1_2_ = 0;
                    local_548.field_2._M_local_buf[3] = '\0';
                    local_548.field_2._M_local_buf[4] = '\0';
                    local_548.field_2._M_local_buf[5] = '\0';
                    local_548.field_2._M_local_buf[6] = '\0';
                    local_548.field_2._M_local_buf[7] = '\0';
                    local_548._M_dataplus._M_p = (pointer)0x0;
                    local_548._M_string_length = 0;
                    local_548.field_2._8_5_ = 0;
                    local_548.field_2._M_local_buf[0xd] = '\0';
                    local_548.field_2._14_2_ = 0x8000;
                    bVar4 = FindMember((json *)err_00,"extensions",(json_const_iterator *)&local_548
                                      );
                    if (bVar4) {
                      pbVar5 = nlohmann::detail::
                               iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                               ::operator*((iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                            *)&local_548);
                      property = (string *)0x0;
                      nlohmann::
                      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                      ::dump(&local_528,pbVar5,-1,' ',false,strict);
                      std::__cxx11::string::operator=((string *)&local_230,(string *)&local_528);
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_528._M_dataplus._M_p != &local_528.field_2) {
                        operator_delete(local_528._M_dataplus._M_p);
                      }
                    }
                    local_548.field_2._M_local_buf[0] = '\0';
                    local_548.field_2._M_allocated_capacity._1_2_ = 0;
                    local_548.field_2._M_local_buf[3] = '\0';
                    local_548.field_2._M_local_buf[4] = '\0';
                    local_548.field_2._M_local_buf[5] = '\0';
                    local_548.field_2._M_local_buf[6] = '\0';
                    local_548.field_2._M_local_buf[7] = '\0';
                    local_548._M_dataplus._M_p = (pointer)0x0;
                    local_548._M_string_length = 0;
                    local_548.field_2._8_5_ = 0;
                    local_548.field_2._M_local_buf[0xd] = '\0';
                    local_548.field_2._14_2_ = 0x8000;
                    bVar4 = FindMember((json *)err_00,"extras",(json_const_iterator *)&local_548);
                    pjVar7 = extraout_RDX_05;
                    if (bVar4) {
                      pbVar5 = nlohmann::detail::
                               iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                               ::operator*((iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                            *)&local_548);
                      property = (string *)0x0;
                      nlohmann::
                      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                      ::dump(&local_528,pbVar5,-1,' ',false,strict);
                      std::__cxx11::string::operator=((string *)&local_250,(string *)&local_528);
                      pjVar7 = extraout_RDX_06;
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_528._M_dataplus._M_p != &local_528.field_2) {
                        operator_delete(local_528._M_dataplus._M_p);
                        pjVar7 = extraout_RDX_07;
                      }
                    }
                  }
                }
                else if (err != (string *)0x0) {
                  std::__cxx11::string::append((char *)err);
                  pjVar7 = extraout_RDX_08;
                }
                if (!bVar3) goto LAB_00119171;
              }
              local_448._4_4_ = local_4f4;
              local_448._0_4_ = local_508;
              ParseExtensionsProperty(local_4b8,psVar6,pjVar7);
              ParseExtrasProperty(&local_420,(json *)psVar6);
              if (cVar2 != '\0') {
                local_548.field_2._M_local_buf[0] = '\0';
                local_548.field_2._M_allocated_capacity._1_2_ = 0;
                local_548.field_2._M_local_buf[3] = '\0';
                local_548.field_2._M_local_buf[4] = '\0';
                local_548.field_2._M_local_buf[5] = '\0';
                local_548.field_2._M_local_buf[6] = '\0';
                local_548.field_2._M_local_buf[7] = '\0';
                local_548._M_dataplus._M_p = (pointer)0x0;
                local_548._M_string_length = 0;
                local_548.field_2._8_5_ = 0;
                local_548.field_2._M_local_buf[0xd] = '\0';
                local_548.field_2._14_2_ = 0x8000;
                bVar3 = FindMember((json *)psVar6,"extensions",(json_const_iterator *)&local_548);
                if (bVar3) {
                  pbVar5 = nlohmann::detail::
                           iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                           ::operator*((iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                        *)&local_548);
                  property = (string *)0x0;
                  nlohmann::
                  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                  ::dump(&local_528,pbVar5,-1,' ',false,strict);
                  std::__cxx11::string::operator=((string *)&local_270,(string *)&local_528);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_528._M_dataplus._M_p != &local_528.field_2) {
                    operator_delete(local_528._M_dataplus._M_p);
                  }
                }
                local_548.field_2._M_local_buf[0] = '\0';
                local_548.field_2._M_allocated_capacity._1_2_ = 0;
                local_548.field_2._M_local_buf[3] = '\0';
                local_548.field_2._M_local_buf[4] = '\0';
                local_548.field_2._M_local_buf[5] = '\0';
                local_548.field_2._M_local_buf[6] = '\0';
                local_548.field_2._M_local_buf[7] = '\0';
                local_548._M_dataplus._M_p = (pointer)0x0;
                local_548._M_string_length = 0;
                local_548.field_2._8_5_ = 0;
                local_548.field_2._M_local_buf[0xd] = '\0';
                local_548.field_2._14_2_ = 0x8000;
                bVar3 = FindMember((json *)psVar6,"extras",(json_const_iterator *)&local_548);
                if (bVar3) {
                  pbVar5 = nlohmann::detail::
                           iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                           ::operator*((iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                        *)&local_548);
                  property = (string *)0x0;
                  nlohmann::
                  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                  ::dump(&local_528,pbVar5,-1,' ',false,strict);
                  std::__cxx11::string::operator=((string *)&local_290,(string *)&local_528);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_528._M_dataplus._M_p != &local_528.field_2) {
                    operator_delete(local_528._M_dataplus._M_p);
                  }
                }
              }
              std::vector<tinygltf::AnimationChannel,_std::allocator<tinygltf::AnimationChannel>_>::
              emplace_back<tinygltf::AnimationChannel>
                        ((vector<tinygltf::AnimationChannel,_std::allocator<tinygltf::AnimationChannel>_>
                          *)(local_1f0 + 0x20),(AnimationChannel *)local_448);
            }
            else if (err != (string *)0x0) {
              std::__cxx11::string::append((char *)err);
            }
LAB_00119171:
            AnimationChannel::~AnimationChannel((AnimationChannel *)local_448);
            nlohmann::detail::
            iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
            ::operator++(&local_468);
            bVar3 = nlohmann::detail::
                    iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                    ::
                    operator==<nlohmann::detail::iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_nullptr>
                              (&local_468,&local_210);
          }
        }
        local_4e8.m_it.array_iterator._M_current =
             (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              *)0x0;
        local_4e8.m_object = (pointer)0x0;
        local_4e8.m_it.object_iterator._M_node = (_Base_ptr)0x0;
        local_4e8.m_it.primitive_iterator.m_it = -0x8000000000000000;
        bVar3 = FindMember((json *)local_500,"samplers",&local_4e8);
        local_504 = (undefined4)CONCAT71((int7)((ulong)property >> 8),1);
        if ((bVar3) &&
           (pbVar5 = nlohmann::detail::
                     iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                     ::operator*(&local_4e8), pbVar5->m_type == array)) {
          pbVar5 = nlohmann::detail::
                   iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                   ::operator*(&local_4e8);
          nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          ::cbegin(&local_4a8,pbVar5);
          nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          ::cend(&local_210,pbVar5);
          bVar3 = nlohmann::detail::
                  iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                  ::
                  operator==<nlohmann::detail::iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_nullptr>
                            (&local_4a8,&local_210);
          while (bVar3 == false) {
            psVar6 = (string *)
                     nlohmann::detail::
                     iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                     ::operator*(&local_4a8);
            AnimationSampler::AnimationSampler((AnimationSampler *)local_448);
            local_468.m_object._0_4_ = 0xffffffff;
            local_508 = -1;
            local_548._M_dataplus._M_p = (pointer)&local_548.field_2;
            local_548.field_2._M_local_buf[4] = 't';
            local_548.field_2._M_local_buf[0] = 'i';
            local_548.field_2._M_allocated_capacity._1_2_ = 0x706e;
            local_548.field_2._M_local_buf[3] = 'u';
            local_548._M_string_length = 5;
            local_548.field_2._M_local_buf[5] = '\0';
            local_528._M_string_length = 0;
            local_528.field_2._M_allocated_capacity =
                 local_528.field_2._M_allocated_capacity & 0xffffffffffffff00;
            local_528._M_dataplus._M_p = (pointer)&local_528.field_2;
            bVar3 = ParseIntegerProperty
                              ((int *)&local_468,err,(json *)psVar6,&local_548,true,&local_528);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_528._M_dataplus._M_p != &local_528.field_2) {
              operator_delete(local_528._M_dataplus._M_p);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_548._M_dataplus._M_p != &local_548.field_2) {
              operator_delete(local_548._M_dataplus._M_p);
            }
            if (!bVar3) {
LAB_001195a4:
              if (err != (string *)0x0) {
                std::__cxx11::string::append((char *)err);
              }
              AnimationSampler::~AnimationSampler((AnimationSampler *)local_448);
              local_504 = 0;
              break;
            }
            local_548._M_dataplus._M_p = (pointer)&local_548.field_2;
            local_548.field_2._8_5_ = 0x6e6f697461;
            local_548.field_2._M_local_buf[0] = 'i';
            local_548.field_2._M_allocated_capacity._1_2_ = 0x746e;
            local_548.field_2._M_local_buf[3] = 'e';
            local_548.field_2._M_local_buf[4] = 'r';
            local_548.field_2._M_local_buf[5] = 'p';
            local_548.field_2._M_local_buf[6] = 'o';
            local_548.field_2._M_local_buf[7] = 'l';
            local_548._M_string_length = 0xd;
            local_548.field_2._M_local_buf[0xd] = '\0';
            paVar1 = &local_528.field_2;
            local_528._M_string_length = 0;
            local_528.field_2._M_allocated_capacity =
                 local_528.field_2._M_allocated_capacity & 0xffffffffffffff00;
            local_528._M_dataplus._M_p = (pointer)paVar1;
            ParseStringProperty((string *)(local_448 + 8),err,(json *)psVar6,&local_548,false,
                                &local_528);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_528._M_dataplus._M_p != paVar1) {
              operator_delete(local_528._M_dataplus._M_p);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_548._M_dataplus._M_p != &local_548.field_2) {
              operator_delete(local_548._M_dataplus._M_p);
            }
            local_548._M_dataplus._M_p = (pointer)&local_548.field_2;
            local_548.field_2._M_local_buf[4] = 'u';
            local_548.field_2._M_local_buf[5] = 't';
            local_548.field_2._M_local_buf[0] = 'o';
            local_548.field_2._M_allocated_capacity._1_2_ = 0x7475;
            local_548.field_2._M_local_buf[3] = 'p';
            local_548._M_string_length = 6;
            local_548.field_2._M_local_buf[6] = '\0';
            local_528._M_string_length = 0;
            local_528.field_2._M_allocated_capacity =
                 local_528.field_2._M_allocated_capacity & 0xffffffffffffff00;
            local_528._M_dataplus._M_p = (pointer)paVar1;
            bVar3 = ParseIntegerProperty(&local_508,err,(json *)psVar6,&local_548,true,&local_528);
            pjVar7 = extraout_RDX_09;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_528._M_dataplus._M_p != paVar1) {
              operator_delete(local_528._M_dataplus._M_p);
              pjVar7 = extraout_RDX_10;
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_548._M_dataplus._M_p != &local_548.field_2) {
              operator_delete(local_548._M_dataplus._M_p);
              pjVar7 = extraout_RDX_11;
            }
            if (!bVar3) goto LAB_001195a4;
            local_448._4_4_ = local_508;
            local_448._0_4_ = local_468.m_object._0_4_;
            ParseExtensionsProperty(local_4b8,psVar6,pjVar7);
            ParseExtrasProperty(&local_420,(json *)psVar6);
            if (cVar2 != '\0') {
              local_548.field_2._M_local_buf[0] = '\0';
              local_548.field_2._M_allocated_capacity._1_2_ = 0;
              local_548.field_2._M_local_buf[3] = '\0';
              local_548.field_2._M_local_buf[4] = '\0';
              local_548.field_2._M_local_buf[5] = '\0';
              local_548.field_2._M_local_buf[6] = '\0';
              local_548.field_2._M_local_buf[7] = '\0';
              local_548._M_dataplus._M_p = (pointer)0x0;
              local_548._M_string_length = 0;
              local_548.field_2._8_5_ = 0;
              local_548.field_2._M_local_buf[0xd] = '\0';
              local_548.field_2._14_2_ = 0x8000;
              bVar3 = FindMember((json *)psVar6,"extensions",(json_const_iterator *)&local_548);
              if (bVar3) {
                pbVar5 = nlohmann::detail::
                         iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                         ::operator*((iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                      *)&local_548);
                nlohmann::
                basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                ::dump(&local_528,pbVar5,-1,' ',false,strict);
                std::__cxx11::string::operator=
                          ((string *)local_4b0->_M_local_buf,(string *)&local_528);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_528._M_dataplus._M_p != &local_528.field_2) {
                  operator_delete(local_528._M_dataplus._M_p);
                }
              }
              local_548.field_2._M_local_buf[0] = '\0';
              local_548.field_2._M_allocated_capacity._1_2_ = 0;
              local_548.field_2._M_local_buf[3] = '\0';
              local_548.field_2._M_local_buf[4] = '\0';
              local_548.field_2._M_local_buf[5] = '\0';
              local_548.field_2._M_local_buf[6] = '\0';
              local_548.field_2._M_local_buf[7] = '\0';
              local_548._M_dataplus._M_p = (pointer)0x0;
              local_548._M_string_length = 0;
              local_548.field_2._8_5_ = 0;
              local_548.field_2._M_local_buf[0xd] = '\0';
              local_548.field_2._14_2_ = 0x8000;
              bVar3 = FindMember((json *)psVar6,"extras",(json_const_iterator *)&local_548);
              if (bVar3) {
                pbVar5 = nlohmann::detail::
                         iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                         ::operator*((iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                      *)&local_548);
                nlohmann::
                basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                ::dump(&local_528,pbVar5,-1,' ',false,strict);
                std::__cxx11::string::operator=((string *)local_4c0,(string *)&local_528);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_528._M_dataplus._M_p != &local_528.field_2) {
                  operator_delete(local_528._M_dataplus._M_p);
                }
              }
            }
            std::vector<tinygltf::AnimationSampler,_std::allocator<tinygltf::AnimationSampler>_>::
            emplace_back<tinygltf::AnimationSampler>
                      ((vector<tinygltf::AnimationSampler,_std::allocator<tinygltf::AnimationSampler>_>
                        *)(local_1f0 + 0x38),(AnimationSampler *)local_448);
            AnimationSampler::~AnimationSampler((AnimationSampler *)local_448);
            nlohmann::detail::
            iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
            ::operator++(&local_4a8);
            bVar3 = nlohmann::detail::
                    iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                    ::
                    operator==<nlohmann::detail::iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_nullptr>
                              (&local_4a8,&local_210);
          }
        }
        psVar6 = local_500;
        if ((char)local_504 == '\0') {
LAB_00119824:
          Animation::~Animation((Animation *)local_1f0);
          return false;
        }
        local_448._0_8_ = local_448 + 0x10;
        local_448._8_8_ =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)0x4;
        local_448._16_5_ = 0x656d616e;
        local_548._M_string_length = 0;
        local_548.field_2._M_local_buf[0] = '\0';
        local_548._M_dataplus._M_p = (pointer)&local_548.field_2;
        ParseStringProperty((string *)local_1f0,err,(json *)local_500,(string *)local_448,false,
                            &local_548);
        pjVar7 = extraout_RDX_12;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_548._M_dataplus._M_p != &local_548.field_2) {
          operator_delete(local_548._M_dataplus._M_p);
          pjVar7 = extraout_RDX_13;
        }
        if ((undefined1 *)local_448._0_8_ != local_448 + 0x10) {
          operator_delete((void *)local_448._0_8_);
          pjVar7 = extraout_RDX_14;
        }
        ParseExtensionsProperty(local_480,psVar6,pjVar7);
        ParseExtrasProperty((Value *)(local_1f0 + 0x50),(json *)local_500);
        if (cVar2 != '\0') {
          local_448._16_8_ = 0;
          local_448._0_8_ = (pointer)0x0;
          local_448._8_8_ = (_Base_ptr)0x0;
          aStack_430._M_allocated_capacity = 0x8000000000000000;
          bVar3 = FindMember((json *)local_500,"extensions",(json_const_iterator *)local_448);
          if (bVar3) {
            pbVar5 = nlohmann::detail::
                     iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                     ::operator*((iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                  *)local_448);
            nlohmann::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
            ::dump(&local_548,pbVar5,-1,' ',false,strict);
            std::__cxx11::string::operator=((string *)&local_b8,(string *)&local_548);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_548._M_dataplus._M_p != &local_548.field_2) {
              operator_delete(local_548._M_dataplus._M_p);
            }
          }
          local_448._16_8_ = 0;
          local_448._0_8_ = (pointer)0x0;
          local_448._8_8_ =
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)0x0;
          aStack_430._M_allocated_capacity = 0x8000000000000000;
          bVar3 = FindMember((json *)local_500,"extras",(json_const_iterator *)local_448);
          if (bVar3) {
            pbVar5 = nlohmann::detail::
                     iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                     ::operator*((iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                  *)local_448);
            nlohmann::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
            ::dump(&local_548,pbVar5,-1,' ',false,strict);
            std::__cxx11::string::operator=((string *)&local_d8,(string *)&local_548);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_548._M_dataplus._M_p != &local_548.field_2) {
              operator_delete(local_548._M_dataplus._M_p);
            }
          }
        }
        if ((char)local_504 == '\0') goto LAB_00119824;
        std::vector<tinygltf::Animation,_std::allocator<tinygltf::Animation>_>::
        emplace_back<tinygltf::Animation>
                  ((vector<tinygltf::Animation,_std::allocator<tinygltf::Animation>_> *)
                   (**(long **)(local_4f0 + 0x10) + 0x18),(Animation *)local_1f0);
        Animation::~Animation((Animation *)local_1f0);
        if ((char)local_504 == '\0') {
          return false;
        }
        nlohmann::detail::
        iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
        ::operator++(&local_70);
        bVar3 = nlohmann::detail::
                iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                ::
                operator==<nlohmann::detail::iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_nullptr>
                          (&local_70,&local_50);
      } while (!bVar3);
    }
  }
  return true;
}

Assistant:

bool ForEachInArray(const detail::json &_v, const char *member, Callback &&cb) {
  detail::json_const_iterator itm;
  if (detail::FindMember(_v, member, itm) &&
      detail::IsArray(detail::GetValue(itm))) {
    const detail::json &root = detail::GetValue(itm);
    auto it = detail::ArrayBegin(root);
    auto end = detail::ArrayEnd(root);
    for (; it != end; ++it) {
      if (!cb(*it)) return false;
    }
  }
  return true;
}